

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O3

bool __thiscall SVGChart::LinTickIterator::Init(LinTickIterator *this)

{
  AxisSetup *pAVar1;
  float fVar2;
  float fVar3;
  
  pAVar1 = (this->super_TickIterator).mAxisSetup;
  if (pAVar1 != (AxisSetup *)0x0) {
    fVar2 = pAVar1->mMin;
    fVar3 = (pAVar1->mTickInfo).mMajorTickSpan / (float)(pAVar1->mTickInfo).mTickDivision;
    this->mDelta = fVar3;
    fVar2 = ceilf(fVar2 / fVar3);
    this->mCount = (long)fVar2;
    this->mCurrentTick = (float)(long)fVar2 * fVar3;
    std::__cxx11::string::_M_assign((string *)&this->mFormatString);
  }
  return pAVar1 != (AxisSetup *)0x0;
}

Assistant:

bool LinTickIterator::Init () {
      if (!mAxisSetup) {
        return false;
      }

      float theMin = mAxisSetup->mMin;
      float theMajorTickSpan = mAxisSetup->mTickInfo.mMajorTickSpan;
      int theDiv = mAxisSetup->mTickInfo.mTickDivision;
      mDelta = theMajorTickSpan/theDiv;
      mCount = ceil (theMin/mDelta);
      mCurrentTick = mCount*mDelta;

      mFormatString = mAxisSetup->mTickInfo.mFormatString;

      return true;

    }